

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

qsizetype stringWidth(QStringView text)

{
  long lVar1;
  long in_FS_OFFSET;
  QStringIterator local_30;
  long local_18;
  
  local_30.i = (const_iterator)text.m_data;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.e = local_30.i + text.m_size;
  lVar1 = 0;
  local_30.pos = local_30.i;
  while (local_30.pos < local_30.e) {
    lVar1 = lVar1 + 1;
    QStringIterator::next(&local_30,L'�');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return lVar1;
  }
  __stack_chk_fail();
}

Assistant:

static qsizetype stringWidth(QStringView text)
{
    QStringIterator counter(text);
    qsizetype count = 0;
    while (counter.hasNext()) {
        ++count;
        [[maybe_unused]] auto ch = counter.next();
    }
    return count;
}